

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O2

bool Imf_3_2::anon_unknown_0::readDeepTile<Imf_3_2::DeepTiledInputFile>
               (DeepTiledInputFile *in,bool reduceMemory,bool reduceTime)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int ty;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Header *pHVar9;
  uint *puVar10;
  _Rb_tree_node_base *p_Var11;
  _Rb_tree_node_base *p_Var12;
  long size;
  int x;
  size_type __new_size;
  int iVar13;
  ulong uVar14;
  int tx;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  bool bVar24;
  long local_150;
  Array2D<unsigned_int> localSampleCount;
  Array<Imf_3_2::Array2D<float_*>_> data;
  vector<float,_std::allocator<float>_> pixelBuffer;
  DeepFrameBuffer frameBuffer;
  
  Imf_3_2::DeepTiledInputFile::header();
  localSampleCount._sizeX = 0;
  localSampleCount._sizeY = 0;
  localSampleCount._data = (uint *)0x0;
  pHVar9 = (Header *)Imf_3_2::DeepTiledInputFile::header();
  iVar4 = Imf_3_2::calculateBytesPerPixel(pHVar9);
  Imf_3_2::DeepTiledInputFile::header();
  puVar10 = (uint *)Imf_3_2::Header::tileDescription();
  uVar2 = *puVar10;
  lVar18 = (long)(int)uVar2;
  uVar3 = puVar10[1];
  iVar5 = Imf_3_2::DeepTiledInputFile::numYLevels();
  iVar6 = Imf_3_2::DeepTiledInputFile::numXLevels();
  Array2D<unsigned_int>::resizeErase(&localSampleCount,(long)(int)uVar3,lVar18);
  Imf_3_2::Header::channels();
  p_Var11 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
  size = 0;
  while( true ) {
    Imf_3_2::Header::channels();
    p_Var12 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
    if (p_Var11 == p_Var12) break;
    p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
    size = size + 1;
  }
  Array<Imf_3_2::Array2D<float_*>_>::Array(&data,size);
  lVar20 = 0;
  lVar23 = size;
  while (bVar24 = lVar23 != 0, lVar23 = lVar23 + -1, bVar24) {
    Array2D<float_*>::resizeErase
              ((Array2D<float_*> *)((long)&(data._data)->_sizeX + lVar20),(long)(int)uVar3,lVar18);
    lVar20 = lVar20 + 0x18;
  }
  DeepFrameBuffer::DeepFrameBuffer(&frameBuffer);
  Imf_3_2::Slice::Slice
            ((Slice *)&pixelBuffer,UINT,(char *)localSampleCount._data,4,lVar18 * 4,1,1,0.0,true,
             true);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  Imf_3_2::Header::channels();
  p_Var11 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
  local_150 = 0x10;
  while( true ) {
    Imf_3_2::Header::channels();
    p_Var12 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
    if (p_Var11 == p_Var12) break;
    Imf_3_2::DeepSlice::DeepSlice
              ((DeepSlice *)&pixelBuffer,FLOAT,*(char **)((long)&(data._data)->_sizeX + local_150),8
               ,(long)(int)(uVar2 * 8),4,1,1,0.0,true,true);
    Imf_3_2::DeepFrameBuffer::insert((char *)&frameBuffer,(DeepSlice *)(p_Var11 + 1));
    p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
    local_150 = local_150 + 0x18;
  }
  Imf_3_2::DeepTiledInputFile::setFrameBuffer((DeepFrameBuffer *)in);
  pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  uVar21 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar21 = 0;
  }
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  for (iVar19 = 0; iVar19 != iVar5; iVar19 = iVar19 + 1) {
    for (iVar22 = 0; iVar22 != iVar6; iVar22 = iVar22 + 1) {
      iVar1 = 0;
      while( true ) {
        iVar13 = (int)in;
        iVar7 = Imf_3_2::DeepTiledInputFile::numYTiles(iVar13);
        if (iVar7 <= iVar1) break;
        iVar7 = 0;
        while( true ) {
          iVar8 = Imf_3_2::DeepTiledInputFile::numXTiles(iVar13);
          if (iVar8 <= iVar7) break;
          Imf_3_2::DeepTiledInputFile::readPixelSampleCounts(iVar13,iVar7,iVar1,iVar7,iVar1,iVar22);
          __new_size = 0;
          lVar18 = 0;
          puVar10 = localSampleCount._data;
          for (uVar14 = 0; uVar14 != uVar21; uVar14 = uVar14 + 1) {
            for (uVar15 = 0; uVar2 != uVar15; uVar15 = uVar15 + 1) {
              uVar17 = (ulong)((int)size * puVar10[uVar15]);
              lVar18 = lVar18 + uVar17;
              uVar16 = 0;
              if (puVar10[uVar15] * iVar4 < 0x1000) {
                uVar16 = uVar17;
              }
              if (!reduceMemory) {
                uVar16 = uVar17;
              }
              __new_size = __new_size + uVar16;
            }
            puVar10 = puVar10 + localSampleCount._sizeY;
          }
          if ((__new_size != 0) && ((!reduceMemory || ((lVar18 + __new_size) * (long)iVar4 < 1000)))
             ) {
            std::vector<float,_std::allocator<float>_>::resize(&pixelBuffer,__new_size);
            lVar18 = 0;
            for (uVar14 = 0; uVar14 != uVar21; uVar14 = uVar14 + 1) {
              for (uVar15 = 0; uVar15 != uVar2; uVar15 = uVar15 + 1) {
                if ((reduceMemory) &&
                   (999 < localSampleCount._data[localSampleCount._sizeY * uVar14 + uVar15] * iVar4)
                   ) {
                  lVar23 = 0x10;
                  lVar20 = size;
                  while (bVar24 = lVar20 != 0, lVar20 = lVar20 + -1, bVar24) {
                    *(undefined8 *)
                     (*(long *)((long)data._data + lVar23 + -8) * uVar14 * 8 +
                      *(long *)((long)&(data._data)->_sizeX + lVar23) + uVar15 * 8) = 0;
                    lVar23 = lVar23 + 0x18;
                  }
                }
                else {
                  lVar23 = 0x10;
                  lVar20 = size;
                  while (bVar24 = lVar20 != 0, lVar20 = lVar20 + -1, bVar24) {
                    *(pointer *)
                     (*(long *)((long)data._data + lVar23 + -8) * uVar14 * 8 +
                      *(long *)((long)&(data._data)->_sizeX + lVar23) + uVar15 * 8) =
                         pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar18;
                    lVar18 = lVar18 + (ulong)localSampleCount._data
                                             [localSampleCount._sizeY * uVar14 + uVar15];
                    lVar23 = lVar23 + 0x18;
                  }
                }
              }
            }
            Imf_3_2::DeepTiledInputFile::readTile(iVar13,iVar7,iVar1,iVar22);
          }
          iVar7 = iVar7 + 1;
        }
        iVar1 = iVar1 + 1;
      }
    }
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&pixelBuffer.super__Vector_base<float,_std::allocator<float>_>);
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
               *)&frameBuffer);
  Array<Imf_3_2::Array2D<float_*>_>::~Array(&data);
  Array2D<unsigned_int>::~Array2D(&localSampleCount);
  return false;
}

Assistant:

bool
readDeepTile (T& in, bool reduceMemory, bool reduceTime)
{
    bool threw = false;
    try
    {
        const Header& fileHeader = in.header ();

        Array2D<unsigned int> localSampleCount;

        int      bytesPerSample = calculateBytesPerPixel (in.header ());

        const TileDescription& td         = in.header ().tileDescription ();
        int                    tileWidth  = td.xSize;
        int                    tileHeight = td.ySize;
        int                    numYLevels = in.numYLevels ();
        int                    numXLevels = in.numXLevels ();

        localSampleCount.resizeErase (tileHeight, tileWidth);

        int channelCount = 0;
        for (ChannelList::ConstIterator i = fileHeader.channels ().begin ();
             i != fileHeader.channels ().end ();
             ++i, channelCount++)
            ;

        Array<Array2D<float*>> data (channelCount);

        for (int i = 0; i < channelCount; i++)
        {
            data[i].resizeErase (tileHeight, tileWidth);
        }

        DeepFrameBuffer frameBuffer;

        //
        // Use integer arithmetic instead of pointer arithmetic to compute offset into array.
        // if memOffset is larger than base, then the computed pointer is negative, which is reported as undefined behavior
        // Instead, integers are used for computation which behaves as expected an all known architectures
        //

        frameBuffer.insertSampleCountSlice (Slice (
            UINT,
            reinterpret_cast<char*> (&localSampleCount[0][0]),
            sizeof (unsigned int) * 1,
            sizeof (unsigned int) * tileWidth,
            1,
            1,    // x/ysampling
            0.0,  // fill
            true, // relative x
            true  // relative y
            ));

        int channel = 0;
        for (ChannelList::ConstIterator i = fileHeader.channels ().begin ();
             i != fileHeader.channels ().end ();
             ++i, ++channel)
        {
            int sampleSize = sizeof (float);

            int pointerSize = sizeof (char*);

            frameBuffer.insert (
                i.name (),
                DeepSlice (
                    FLOAT,
                    reinterpret_cast<char*> (&data[channel][0][0]),
                    pointerSize * 1,
                    pointerSize * tileWidth,
                    sampleSize,
                    1,
                    1,
                    0.0,
                    true,
                    true));
        }

        in.setFrameBuffer (frameBuffer);
        size_t step = 1;

        int  tileIndex = 0;
        bool isRipMap  = td.mode == RIPMAP_LEVELS;

        vector<float> pixelBuffer;

        //
        // read all tiles from all levels.
        //
        for (int ylevel = 0; ylevel < numYLevels; ++ylevel)
        {
            for (int xlevel = 0; xlevel < numXLevels; ++xlevel)
            {
                for (int y = 0; y < in.numYTiles (ylevel); ++y)
                {
                    for (int x = 0; x < in.numXTiles (xlevel); ++x)
                    {
                        if (tileIndex % step == 0)
                        {
                            try
                            {

                                in.readPixelSampleCounts (
                                    x, y, x, y, xlevel, ylevel);

                                size_t bufferSize = 0;
                                size_t fileBufferSize = 0;

                                for (int ty = 0; ty < tileHeight; ++ty)
                                {
                                    for (int tx = 0; tx < tileWidth; ++tx)
                                    {
                                        fileBufferSize += channelCount *
                                                localSampleCount[ty][tx];

                                        if (!reduceMemory ||
                                            localSampleCount[ty][tx] *
                                                    bytesPerSample <
                                                gMaxBytesPerDeepScanline)
                                        {
                                            bufferSize +=
                                                channelCount *
                                                localSampleCount[ty][tx];
                                        }
                                    }
                                }

                                // skip reading if no data to read, or limiting memory and tile is too large
                                if (bufferSize > 0 &&
                                    (!reduceMemory ||
                                     (fileBufferSize + bufferSize) * bytesPerSample <
                                         gMaxBytesPerDeepPixel))
                                {

                                    pixelBuffer.resize (bufferSize);
                                    size_t bufferIndex = 0;

                                    for (int ty = 0; ty < tileHeight; ++ty)
                                    {
                                        for (int tx = 0; tx < tileWidth; ++tx)
                                        {
                                            if (!reduceMemory ||
                                                localSampleCount[ty][tx] *
                                                        bytesPerSample <
                                                    gMaxBytesPerDeepPixel)
                                            {
                                                for (int k = 0;
                                                     k < channelCount;
                                                     ++k)
                                                {
                                                    data[k][ty][tx] =
                                                        &pixelBuffer
                                                            [bufferIndex];
                                                    bufferIndex +=
                                                        localSampleCount[ty]
                                                                        [tx];
                                                }
                                            }
                                            else
                                            {
                                                for (int k = 0;
                                                     k < channelCount;
                                                     ++k)
                                                {
                                                    data[k][ty][tx] = nullptr;
                                                }
                                            }
                                        }
                                    }

                                    in.readTile (x, y, xlevel, ylevel);
                                }
                            }

                            catch (...)
                            {
                                //
                                // for one level and mipmapped images,
                                // xlevel must match ylevel,
                                // otherwise an exception is thrown
                                // ignore that exception
                                //
                                if (isRipMap || xlevel == ylevel)
                                {
                                    threw = true;
                                    //
                                    // in reduceTime mode, fail immediately - the file is corrupt
                                    //
                                    if (reduceTime) { return threw; }
                                }
                            }
                        }
                        tileIndex++;
                    }
                }
            }
        }
    }
    catch (...)
    {
        threw = true;
    }
    return threw;
}